

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::assign_op<int,_int>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::assign_op<int,_int>,_0>
           *kernel)

{
  int *piVar1;
  int *piVar2;
  long end;
  undefined8 uVar3;
  long start;
  Index index;
  long lVar4;
  
  end = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
        m_rows;
  start = (end / 4) * 4;
  for (lVar4 = 0; lVar4 < start; lVar4 = lVar4 + 4) {
    piVar1 = (kernel->m_src->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>).m_d.data
             + lVar4;
    uVar3 = *(undefined8 *)(piVar1 + 2);
    piVar2 = (kernel->m_dst->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>).m_d.
             data + lVar4;
    *(undefined8 *)piVar2 = *(undefined8 *)piVar1;
    *(undefined8 *)(piVar2 + 2) = uVar3;
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_1,1,0,_1,1>>,Eigen::internal::evaluator<Eigen::Matrix<int,4,1,0,4,1>>,Eigen::internal::assign_op<int,int>,0>>
            (kernel,start,end);
  return;
}

Assistant:

Index size() const EIGEN_NOEXCEPT { return m_dstExpr.size(); }